

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool IsHit(bitset<32UL> flags)

{
  bool bVar1;
  bool bVar2;
  reference local_108;
  reference local_f8;
  reference local_e8;
  reference local_d8;
  reference local_c8;
  bitset<32UL> local_b8;
  bitset<32UL> flags_set;
  reference local_a0;
  reference local_90;
  reference local_80;
  reference local_70;
  reference local_60 [2];
  reference local_40;
  reference local_30;
  bitset<32UL> local_20;
  bitset<32UL> flags_line;
  _Base_bitset<1UL> _Stack_10;
  bool ret;
  bitset<32UL> flags_local;
  
  flags_line.super__Base_bitset<1UL>._M_w._7_1_ = 0;
  _Stack_10 = flags.super__Base_bitset<1UL>._M_w;
  if (t_assoc == direct_mapped) {
    std::bitset<32UL>::bitset(&local_20);
    j = 0;
    for (i = (unsigned_long)bit_block; i < (ulong)(long)(int)((uint)bit_block + (uint)bit_line);
        i = i + 1) {
      std::bitset<32UL>::operator[]((bitset<32UL> *)&local_30,(size_t)&stack0xfffffffffffffff0);
      std::bitset<32UL>::operator[]((bitset<32UL> *)&local_40,(size_t)&local_20);
      std::bitset<32UL>::reference::operator=(&local_40,&local_30);
      std::bitset<32UL>::reference::~reference(&local_40);
      std::bitset<32UL>::reference::~reference(&local_30);
      j = j + 1;
    }
    current_line = std::bitset<32UL>::to_ulong(&local_20);
    std::bitset<32UL>::operator[]((bitset<32UL> *)local_60,(size_t)(cache_item + current_line));
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_60);
    std::bitset<32UL>::reference::~reference(local_60);
    if (bVar1) {
      flags_line.super__Base_bitset<1UL>._M_w._7_1_ = 1;
      j = 0x1c;
      for (i = 0x1f; 0x1f - (ulong)bit_tag < i; i = i - 1) {
        std::bitset<32UL>::operator[]((bitset<32UL> *)&local_70,(size_t)&stack0xfffffffffffffff0);
        bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_70);
        std::bitset<32UL>::operator[]((bitset<32UL> *)&local_80,(size_t)(cache_item + current_line))
        ;
        bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&local_80);
        std::bitset<32UL>::reference::~reference(&local_80);
        std::bitset<32UL>::reference::~reference(&local_70);
        if (bVar1 != bVar2) {
          flags_line.super__Base_bitset<1UL>._M_w._7_1_ = 0;
          break;
        }
        j = j - 1;
      }
    }
  }
  else if (t_assoc == full_associative) {
    for (temp = 0; temp < i_num_line; temp = temp + 1) {
      std::bitset<32UL>::operator[]((bitset<32UL> *)&local_90,(size_t)(cache_item + temp));
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_90);
      std::bitset<32UL>::reference::~reference(&local_90);
      if (bVar1) {
        flags_line.super__Base_bitset<1UL>._M_w._7_1_ = 1;
        j = 0x1c;
        for (i = 0x1f; 0x1f - (ulong)bit_tag < i; i = i - 1) {
          std::bitset<32UL>::operator[]((bitset<32UL> *)&local_a0,(size_t)&stack0xfffffffffffffff0);
          bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_a0);
          std::bitset<32UL>::operator[](&flags_set,(size_t)(cache_item + temp));
          bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&flags_set);
          std::bitset<32UL>::reference::~reference((reference *)&flags_set);
          std::bitset<32UL>::reference::~reference(&local_a0);
          if (bVar1 != bVar2) {
            flags_line.super__Base_bitset<1UL>._M_w._7_1_ = 0;
            break;
          }
          j = j - 1;
        }
      }
      if ((flags_line.super__Base_bitset<1UL>._M_w._7_1_ & 1) != 0) {
        current_line = temp;
        break;
      }
    }
  }
  else if (t_assoc == set_associative) {
    std::bitset<32UL>::bitset(&local_b8);
    j = 0;
    for (i = (unsigned_long)bit_block; i < (ulong)(long)(int)((uint)bit_block + (uint)bit_set);
        i = i + 1) {
      std::bitset<32UL>::operator[]((bitset<32UL> *)&local_c8,(size_t)&stack0xfffffffffffffff0);
      std::bitset<32UL>::operator[]((bitset<32UL> *)&local_d8,(size_t)&local_b8);
      std::bitset<32UL>::reference::operator=(&local_d8,&local_c8);
      std::bitset<32UL>::reference::~reference(&local_d8);
      std::bitset<32UL>::reference::~reference(&local_c8);
      j = j + 1;
    }
    current_set = std::bitset<32UL>::to_ulong(&local_b8);
    for (temp = current_set * i_cache_set; temp < (current_set + 1) * i_cache_set; temp = temp + 1)
    {
      std::bitset<32UL>::operator[]((bitset<32UL> *)&local_e8,(size_t)(cache_item + temp));
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_e8);
      std::bitset<32UL>::reference::~reference(&local_e8);
      if (bVar1) {
        flags_line.super__Base_bitset<1UL>._M_w._7_1_ = 1;
        j = 0x1c;
        for (i = 0x1f; 0x1f - (ulong)bit_tag < i; i = i - 1) {
          std::bitset<32UL>::operator[]((bitset<32UL> *)&local_f8,(size_t)&stack0xfffffffffffffff0);
          bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_f8);
          std::bitset<32UL>::operator[]((bitset<32UL> *)&local_108,(size_t)(cache_item + temp));
          bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&local_108);
          std::bitset<32UL>::reference::~reference(&local_108);
          std::bitset<32UL>::reference::~reference(&local_f8);
          if (bVar1 != bVar2) {
            flags_line.super__Base_bitset<1UL>._M_w._7_1_ = 0;
            break;
          }
          j = j - 1;
        }
      }
      if ((flags_line.super__Base_bitset<1UL>._M_w._7_1_ & 1) != 0) {
        current_line = temp;
        break;
      }
    }
  }
  return (bool)(flags_line.super__Base_bitset<1UL>._M_w._7_1_ & 1);
}

Assistant:

bool IsHit(bitset<32> flags)
{
    bool ret = false;

    if(t_assoc == direct_mapped)
    {
        bitset<32> flags_line; // a temp variable

        for(j=0,i=(bit_block); i<(bit_block+bit_line); j++,i++) //判断在cache多少行
        {
            flags_line[j] = flags[i];
        }

        current_line = flags_line.to_ulong();
        assert(cache_item[current_line][31] == true);

        if(cache_item[current_line][30]) //判断hit位是否为真
        {
            ret = true;

            for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
            {
                if(flags[i] != cache_item[current_line][j])
                {
                    ret = false;
                    break;
                }
            }
        }
    }
    else if(t_assoc == full_associative)
    {
        for(temp=0; temp<i_num_line; temp++)
        {
            if(cache_item[temp][30]) //判断hit位是否为真
            {
                ret = true;

                for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
                {
                    if(flags[i] != cache_item[temp][j])
                    {
                        ret = false;
                        break;
                    }
                }
            }

            if(ret)
            {
                current_line = temp;
                break;
            }
        }
    }
    else if(t_assoc == set_associative)
    {
        bitset<32> flags_set;

        for(j=0,i=(bit_block); i<(bit_block+bit_set); j++,i++) //判断在cache多少组
        {
            flags_set[j] = flags[i];
        }

        current_set = flags_set.to_ulong();

        for(temp=(current_set*i_cache_set); temp<((current_set+1)*i_cache_set); temp++)
        {
            if(cache_item[temp][30]) //判断hit位是否为真
            {
                ret = true;

                for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
                {
                    if(flags[i] != cache_item[temp][j])
                    {
                        ret = false;
                        break;
                    }
                }
            }

            if(ret)
            {
                current_line = temp;
                break;
            }
        }
    }

    return ret;
}